

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

int evmap_foreach_event_(event_base *base,event_base_foreach_event_cb fn,void *arg)

{
  undefined8 *puVar1;
  int iVar2;
  event *peVar3;
  long lVar4;
  bool bVar5;
  
  if ((base->io).nentries < 1) {
    iVar2 = 0;
  }
  else {
    lVar4 = 0;
    iVar2 = 0;
    do {
      puVar1 = (undefined8 *)(base->io).entries[lVar4];
      if (puVar1 == (undefined8 *)0x0) {
        bVar5 = false;
      }
      else {
        peVar3 = (event *)*puVar1;
        while ((iVar2 = 0, peVar3 != (event *)0x0 && (iVar2 = (*fn)(base,peVar3,arg), iVar2 == 0)))
        {
          peVar3 = (peVar3->ev_).ev_io.ev_io_next.le_next;
        }
        bVar5 = iVar2 != 0;
      }
    } while ((!bVar5) && (lVar4 = lVar4 + 1, lVar4 < (base->io).nentries));
  }
  if (iVar2 == 0) {
    if ((base->sigmap).nentries < 1) {
      iVar2 = 0;
    }
    else {
      lVar4 = 0;
      iVar2 = 0;
      do {
        puVar1 = (undefined8 *)(base->sigmap).entries[lVar4];
        if (puVar1 == (undefined8 *)0x0) {
          bVar5 = false;
        }
        else {
          peVar3 = (event *)*puVar1;
          while ((iVar2 = 0, peVar3 != (event *)0x0 && (iVar2 = (*fn)(base,peVar3,arg), iVar2 == 0))
                ) {
            peVar3 = (peVar3->ev_).ev_io.ev_io_next.le_next;
          }
          bVar5 = iVar2 != 0;
        }
      } while ((!bVar5) && (lVar4 = lVar4 + 1, lVar4 < (base->sigmap).nentries));
    }
  }
  return iVar2;
}

Assistant:

int
evmap_foreach_event_(struct event_base *base,
    event_base_foreach_event_cb fn, void *arg)
{
	struct evmap_foreach_event_helper h;
	int r;
	h.fn = fn;
	h.arg = arg;
	if ((r = evmap_io_foreach_fd(base, evmap_io_foreach_event_fn, &h)))
		return r;
	return evmap_signal_foreach_signal(base, evmap_signal_foreach_event_fn, &h);
}